

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void handle_put(mg_connection *nc,char *path,http_message *hm)

{
  size_t *psVar1;
  ulong uVar2;
  char *__dest;
  int iVar3;
  mg_str *pmVar4;
  undefined8 *puVar5;
  FILE *__stream;
  mg_str *header;
  longlong lVar6;
  uint uVar7;
  ulong uVar8;
  int64_t r2;
  char buf [500];
  cs_stat_t st;
  stat64 local_348;
  int64_t local_2b8 [62];
  undefined1 local_c5;
  stat64 local_c0;
  
  pmVar4 = mg_get_http_header(hm,"Content-Length");
  iVar3 = stat64(path,&local_c0);
  uVar7 = 0xc9 - (iVar3 == 0);
  free_http_proto_data(nc);
  uVar8 = 1;
  do {
    if (path[uVar8] == '/') {
      snprintf((char *)local_2b8,500,"%.*s",uVar8 & 0xffffffff,path);
      local_c5 = 0;
      iVar3 = stat64((char *)local_2b8,&local_348);
      if (iVar3 != 0) {
        iVar3 = mkdir((char *)local_2b8,0x1ed);
        if (iVar3 != 0) goto LAB_0010ecc1;
      }
    }
    else if (path[uVar8] == '\0') {
      if (pmVar4 == (mg_str *)0x0) {
        iVar3 = 0x19b;
      }
      else {
        puVar5 = (undefined8 *)calloc(1,0x30);
        if (puVar5 != (undefined8 *)0x0) {
          __stream = fopen64(path,"w+b");
          *puVar5 = __stream;
          if (__stream != (FILE *)0x0) {
            header = mg_get_http_header(hm,"Content-Range");
            local_2b8[0] = 0;
            local_348.st_dev = 0;
            *(undefined4 *)(puVar5 + 5) = 2;
            iVar3 = fileno(__stream);
            fcntl64(iVar3,2,1);
            lVar6 = strtoll(pmVar4->p,(char **)0x0,10);
            puVar5[1] = lVar6;
            if (header != (mg_str *)0x0) {
              iVar3 = parse_range_header(header,local_2b8,(int64_t *)&local_348);
              if (0 < iVar3) {
                fseeko64(__stream,local_2b8[0],0);
                if (local_2b8[0] < (long)local_348.st_dev) {
                  lVar6 = local_348.st_dev + 1;
                }
                puVar5[1] = lVar6 - local_2b8[0];
                uVar7 = 0xce;
              }
            }
            mg_printf(nc,"HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n",(ulong)uVar7);
            nc->proto_data = puVar5;
            uVar8 = (hm->message).len - (hm->body).len;
            if ((uVar8 != 0) && (uVar2 = (nc->recv_mbuf).len, uVar8 <= uVar2)) {
              __dest = (nc->recv_mbuf).buf;
              memmove(__dest,__dest + uVar8,uVar2 - uVar8);
              psVar1 = &(nc->recv_mbuf).len;
              *psVar1 = *psVar1 - uVar8;
            }
            transfer_file_data(nc);
            return;
          }
          mg_send_head(nc,500,0,(char *)0x0);
          free_http_proto_data(nc);
          return;
        }
LAB_0010ecc1:
        iVar3 = 500;
      }
      mg_send_head(nc,iVar3,0,(char *)0x0);
      return;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static void handle_put(struct mg_connection *nc, const char *path,
                       struct http_message *hm) {
    cs_stat_t st;
    const struct mg_str *cl_hdr = mg_get_http_header(hm, "Content-Length");
    int rc, status_code = mg_stat(path, &st) == 0 ? 200 : 201;
    struct proto_data_http *dp = (struct proto_data_http *) nc->proto_data;

    free_http_proto_data(nc);
    if ((rc = create_itermediate_directories(path)) == 0) {
        mg_printf(nc, "HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n", status_code);
    } else if (rc == -1) {
        send_http_error(nc, 500, NULL);
    } else if (cl_hdr == NULL) {
        send_http_error(nc, 411, NULL);
    } else if ((dp = (struct proto_data_http *) MG_CALLOC(1, sizeof(*dp))) ==
               NULL) {
        send_http_error(nc, 500, NULL); /* LCOV_EXCL_LINE */
    } else if ((dp->fp = fopen(path, "w+b")) == NULL) {
        send_http_error(nc, 500, NULL);
        free_http_proto_data(nc);
    } else {
        const struct mg_str *range_hdr = mg_get_http_header(hm, "Content-Range");
        int64_t r1 = 0, r2 = 0;
        dp->type = DATA_PUT;
        mg_set_close_on_exec(fileno(dp->fp));
        dp->cl = to64(cl_hdr->p);
        if (range_hdr != NULL && parse_range_header(range_hdr, &r1, &r2) > 0) {
            status_code = 206;
            fseeko(dp->fp, r1, SEEK_SET);
            dp->cl = r2 > r1 ? r2 - r1 + 1 : dp->cl - r1;
        }
        mg_printf(nc, "HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n", status_code);
        nc->proto_data = dp;
        /* Remove HTTP request from the mbuf, leave only payload */
        mbuf_remove(&nc->recv_mbuf, hm->message.len - hm->body.len);
        transfer_file_data(nc);
    }
}